

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

int __thiscall
KMaxDistance::putValToItsSortedPlace(KMaxDistance *this,double val,double *vals,int numVals)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)numVals;
  if (val <= vals[lVar3 + -1]) {
    return 0;
  }
  for (uVar4 = 0; (uint)(~(numVals >> 0x1f) & numVals) != uVar4; uVar4 = uVar4 + 1) {
    lVar1 = lVar3;
    if (vals[uVar4] < val) goto LAB_00103c06;
  }
LAB_00103c20:
  return (uint)((long)uVar4 < lVar3);
LAB_00103c06:
  while (lVar2 = lVar1 + -1, (long)uVar4 < lVar2) {
    vals[lVar2] = vals[lVar1 + -2];
    lVar1 = lVar2;
  }
  vals[uVar4] = val;
  goto LAB_00103c20;
}

Assistant:

int KMaxDistance::putValToItsSortedPlace( const double val, double *vals, const int numVals ){
    if ( val <= vals[numVals-1] ) return 0;
    for ( int i = 0; i < numVals; ++i ){
        if ( vals[i] >= val ) continue;
        for ( int j = numVals-1; j > i; --j ) vals[j] = vals[j-1];
        vals[i] = val;
        return 1;
    }
    return 0;
}